

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * sqlite3SrcListLookup(Parse *pParse,SrcList *pSrc)

{
  int iVar1;
  Table *pTVar2;
  Table *pTVar3;
  
  pTVar2 = sqlite3LocateTableItem(pParse,0,pSrc->a);
  sqlite3DeleteTable(pParse->db,pSrc->a[0].pTab);
  pSrc->a[0].pTab = pTVar2;
  if (pTVar2 != (Table *)0x0) {
    pTVar2->nTabRef = pTVar2->nTabRef + 1;
  }
  iVar1 = sqlite3IndexedByLookup(pParse,pSrc->a);
  pTVar3 = (Table *)0x0;
  if (iVar1 == 0) {
    pTVar3 = pTVar2;
  }
  return pTVar3;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3SrcListLookup(Parse *pParse, SrcList *pSrc){
  struct SrcList_item *pItem = pSrc->a;
  Table *pTab;
  assert( pItem && pSrc->nSrc==1 );
  pTab = sqlite3LocateTableItem(pParse, 0, pItem);
  sqlite3DeleteTable(pParse->db, pItem->pTab);
  pItem->pTab = pTab;
  if( pTab ){
    pTab->nTabRef++;
  }
  if( sqlite3IndexedByLookup(pParse, pItem) ){
    pTab = 0;
  }
  return pTab;
}